

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void __thiscall ACSStringPool::Dump(ACSStringPool *this)

{
  PoolEntry *pPVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  
  uVar2 = (this->Pool).Count;
  if (uVar2 != 0) {
    lVar3 = 0x10;
    uVar4 = 0;
    do {
      pPVar1 = (this->Pool).Array;
      if (*(int *)((long)pPVar1 + lVar3 + -4) != -2) {
        Printf("%4u. (%2d) \"%s\"\n",uVar4 & 0xffffffff,
               (ulong)*(uint *)((long)&(pPVar1->Str).Chars + lVar3),
               *(undefined8 *)((long)pPVar1 + lVar3 + -0x10));
        uVar2 = (this->Pool).Count;
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x18;
    } while (uVar4 < uVar2);
  }
  Printf("First free %u\n",(ulong)this->FirstFreeEntry);
  return;
}

Assistant:

void ACSStringPool::Dump() const
{
	for (unsigned int i = 0; i < Pool.Size(); ++i)
	{
		if (Pool[i].Next != FREE_ENTRY)
		{
			Printf("%4u. (%2d) \"%s\"\n", i, Pool[i].LockCount, Pool[i].Str.GetChars());
		}
	}
	Printf("First free %u\n", FirstFreeEntry);
}